

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCDPP.h
# Opt level: O3

void __thiscall
CCDPP::predict(CCDPP *this,vector<Rating,_std::allocator<Rating>_> *ratings,string *log)

{
  pool *ppVar1;
  pointer pdVar2;
  ostream *poVar3;
  int iVar4;
  double dVar5;
  undefined1 auVar6 [16];
  int rating_size;
  int workload;
  vector<double,_std::allocator<double>_> rmses;
  allocator_type local_81;
  int local_80;
  int local_7c;
  double local_78;
  string *local_70;
  vector<double,_std::allocator<double>_> local_68;
  function0<void> local_50;
  
  local_80 = (int)((ulong)((long)(ratings->super__Vector_base<Rating,_std::allocator<Rating>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(ratings->super__Vector_base<Rating,_std::allocator<Rating>_>).
                                _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  iVar4 = this->parameter->num_of_thread;
  local_50.super_function_base.vtable = (vtable_base *)0x0;
  local_7c = (local_80 / iVar4 + 1) - (uint)(local_80 % iVar4 == 0);
  local_70 = log;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_68,(long)iVar4,(value_type_conflict1 *)&local_50,&local_81);
  if (0 < this->parameter->num_of_thread) {
    iVar4 = 0;
    do {
      ppVar1 = this->thread_pool;
      local_50.super_function_base.functor.members.obj_ref.obj_ptr = operator_new(0x30);
      local_50.super_function_base.vtable =
           (vtable_base *)
           _ZZN5boost9function0IvE9assign_toISt5_BindIFZN5CCDPP7predictERSt6vectorI6RatingSaIS6_EENSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEEEUliE_iEEEEvT_E13stored_vtable
      ;
      *(int **)local_50.super_function_base.functor.members._0_8_ = &local_7c;
      *(int **)((long)local_50.super_function_base.functor.members._0_8_ + 8) = &local_80;
      *(vector<Rating,_std::allocator<Rating>_> **)
       ((long)local_50.super_function_base.functor.members._0_8_ + 0x10) = ratings;
      *(CCDPP **)((long)local_50.super_function_base.functor.members._0_8_ + 0x18) = this;
      *(vector<double,_std::allocator<double>_> **)
       ((long)local_50.super_function_base.functor.members._0_8_ + 0x20) = &local_68;
      *(int *)((long)local_50.super_function_base.functor.members._0_8_ + 0x28) = iVar4;
      boost::threadpool::detail::
      pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
      ::schedule((ppVar1->m_core).px,&local_50);
      boost::function0<void>::~function0(&local_50);
      iVar4 = iVar4 + 1;
    } while (iVar4 < this->parameter->num_of_thread);
  }
  boost::threadpool::detail::
  pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
  ::wait((this->thread_pool->m_core).px,(void *)0x0);
  local_78 = 0.0;
  for (pdVar2 = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar2 != local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar2 = pdVar2 + 1) {
    local_78 = local_78 + *pdVar2;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(local_70->_M_dataplus)._M_p,local_70->_M_string_length);
  auVar6._0_8_ = local_78 / (double)local_80;
  auVar6._8_8_ = 0;
  if (auVar6._0_8_ < 0.0) {
    dVar5 = sqrt(auVar6._0_8_);
  }
  else {
    auVar6 = vsqrtsd_avx(auVar6,auVar6);
    dVar5 = auVar6._0_8_;
  }
  poVar3 = std::ostream::_M_insert<double>(dVar5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

inline void predict(vector<Rating> &ratings, const string log) {

        int rating_size = ratings.size();
        int workload = rating_size / parameter->num_of_thread + ((rating_size % parameter->num_of_thread == 0) ? 0 : 1);

        vector<value_type> rmses(parameter->num_of_thread, 0);

        for (int thread_index = 0; thread_index < parameter->num_of_thread; thread_index++) {
            thread_pool->schedule(std::bind([&](const int thread_index) {
                int start = workload * thread_index;
                int end = std::min(start + workload, rating_size);

                for (int i = start; i < end; i++) {
                    Rating &rating = ratings[i];
                    value_type prediction = 0;
                    for (int d = 0; d < parameter->k; d++) {
                        prediction += Q[d * user_num + rating.user_id] * P[d * item_num + rating.item_id];
                    }

                    value_type error = rating.score - prediction;
                    rmses[thread_index] += error * error;
                }
            }, thread_index));
        }
        thread_pool->wait();

        value_type result = 0;

        for (value_type rmse:rmses) {
            result += rmse;
        }

        cout << log << sqrt(result / rating_size) << endl;
    }